

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

sequence * toml::detail::syntax::literal_string(spec *s)

{
  either *in_RDI;
  char_type in_stack_ffffffffffffff6f;
  character *in_stack_ffffffffffffff70;
  either *peVar1;
  scanner_base in_stack_ffffffffffffff88;
  repeat_at_least *in_stack_ffffffffffffff90;
  character *in_stack_ffffffffffffff98;
  sequence *in_stack_ffffffffffffffa0;
  
  peVar1 = in_RDI;
  character::character(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f);
  literal_char((spec *)peVar1);
  repeat_at_least::repeat_at_least<toml::detail::either>
            (in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88._vptr_scanner_base,in_RDI);
  peVar1 = (either *)&stack0xffffffffffffff88;
  character::character((character *)peVar1,in_stack_ffffffffffffff6f);
  sequence::sequence<toml::detail::character,toml::detail::repeat_at_least,toml::detail::character>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             (character *)in_stack_ffffffffffffff88._vptr_scanner_base);
  character::~character((character *)0x72a5c5);
  repeat_at_least::~repeat_at_least((repeat_at_least *)peVar1);
  either::~either(peVar1);
  character::~character((character *)0x72a5e3);
  return (sequence *)in_RDI;
}

Assistant:

TOML11_INLINE sequence literal_string(const spec& s)
{
    return sequence(
            character('\''),
            repeat_at_least(0, literal_char(s)),
            character('\'')
        );
}